

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O2

uint __thiscall xercesc_4_0::CMStateSetEnumerator::nextElement(CMStateSetEnumerator *this)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0x20) {
      return 0;
    }
    uVar2 = (uint)(1L << ((byte)lVar3 & 0x3f));
    if ((this->fLastValue & uVar2) != 0) break;
    lVar3 = lVar3 + 1;
  }
  uVar1 = (int)lVar3 + (int)this->fIndexCount;
  uVar2 = this->fLastValue & ~uVar2;
  this->fLastValue = uVar2;
  if (uVar2 != 0) {
    return uVar1;
  }
  findNext(this);
  return uVar1;
}

Assistant:

unsigned int nextElement()
    {
        for(int i=0;i<32;i++)
        {
            XMLInt32 mask=1UL << i;
            if(fLastValue & mask)
            {
                fLastValue &= ~mask;
                unsigned int retVal=(unsigned int)fIndexCount+i;
                if(fLastValue==0)
                    findNext();
                return retVal;
            }
        }
        return 0;
    }